

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_qcc(opj_j2k_t *j2k)

{
  long in_RDI;
  opj_cio_t *cio;
  int numcomp;
  int compno;
  int len;
  int in_stack_00000028;
  int in_stack_0000002c;
  opj_j2k_t *in_stack_00000030;
  int in_stack_ffffffffffffffdc;
  opj_cio_t *cio_00;
  
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  cio_read(cio_00,in_stack_ffffffffffffffdc);
  cio_read(cio_00,in_stack_ffffffffffffffdc);
  j2k_read_qcx(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  return;
}

Assistant:

static void j2k_read_qcc(opj_j2k_t *j2k) {
	int len, compno;
	int numcomp = j2k->image->numcomps;
	opj_cio_t *cio = j2k->cio;

	len = cio_read(cio, 2);	/* Lqcc */
	compno = cio_read(cio, numcomp <= 256 ? 1 : 2);	/* Cqcc */

#ifdef USE_JPWL
	if (j2k->cp->correct) {

		static int backup_compno = 0;

		/* compno is negative or larger than the number of components!!! */
		if ((compno < 0) || (compno >= numcomp)) {
			opj_event_msg(j2k->cinfo, EVT_ERROR,
				"JPWL: bad component number in QCC (%d out of a maximum of %d)\n",
				compno, numcomp);
			if (!JPWL_ASSUME) {
				opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
				return;
			}
			/* we try to correct */
			compno = backup_compno % numcomp;
			opj_event_msg(j2k->cinfo, EVT_WARNING, "- trying to adjust this\n"
				"- setting component number to %d\n",
				compno);
		}

		/* keep your private count of tiles */
		backup_compno++;
	};
#endif /* USE_JPWL */

	j2k_read_qcx(j2k, compno, len - 2 - (numcomp <= 256 ? 1 : 2));
}